

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_parse_urldecode(lws *wsi,uint8_t *_c)

{
  allocated_headers *paVar1;
  allocated_headers *paVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  ah_data_idx_t aVar7;
  bool bVar8;
  uint8_t local_2d;
  uint8_t c;
  uint enc;
  allocated_headers *ah;
  uint8_t *_c_local;
  lws *wsi_local;
  
  paVar1 = (wsi->http).ah;
  bVar3 = false;
  local_2d = *_c;
  cVar4 = paVar1->ues;
  if (cVar4 == '\0') {
    if (local_2d == '%') {
      paVar1->ues = '\x01';
      return 1;
    }
  }
  else {
    if (cVar4 == '\x01') {
      cVar4 = char_to_hex(local_2d);
      if (cVar4 < '\0') {
        return 2;
      }
      paVar1->esc_stash = local_2d;
      paVar1->ues = '\x02';
      return 1;
    }
    if (cVar4 == '\x02') {
      cVar4 = char_to_hex(local_2d);
      if (cVar4 < '\0') {
        return 2;
      }
      cVar4 = char_to_hex(paVar1->esc_stash);
      bVar5 = char_to_hex(local_2d);
      *_c = cVar4 << 4 | bVar5;
      local_2d = *_c;
      bVar3 = true;
      paVar1->ues = '\0';
    }
  }
  if ((local_2d == '\0') &&
     ((paVar1->frag_index[0x4c] == '\0' || (paVar1->post_literal_equal == '\0')))) {
    _lws_log(2,"%s: saw NUL outside of uri args\n","lws_parse_urldecode");
    return -1;
  }
  switch(paVar1->ups) {
  case '\0':
    if (((local_2d == '&') || (local_2d == ';')) && (!bVar3)) {
      iVar6 = issue_char(wsi,'\0');
      if (iVar6 < 0) {
        return -1;
      }
      paVar2 = (wsi->http).ah;
      bVar5 = ((wsi->http).ah)->nfrag;
      paVar2->frags[bVar5].len = paVar2->frags[bVar5].len - 1;
      paVar1->frags[paVar1->nfrag].nfrag = paVar1->nfrag + '\x01';
      paVar1->nfrag = paVar1->nfrag + '\x01';
      if (0x5f < paVar1->nfrag) {
        return 3;
      }
      paVar1->post_literal_equal = '\0';
      aVar7 = paVar1->pos + 1;
      paVar1->pos = aVar7;
      paVar1->frags[paVar1->nfrag].offset = aVar7;
      paVar1->frags[paVar1->nfrag].len = 0;
      paVar1->frags[paVar1->nfrag].nfrag = '\0';
      return 1;
    }
    if (((local_2d == '=') && (bVar3)) &&
       ((paVar1->frag_index[0x4c] != '\0' && (paVar1->post_literal_equal == '\0')))) {
      local_2d = '_';
      *_c = '_';
    }
    if ((local_2d == '=') && (!bVar3)) {
      paVar1->post_literal_equal = '\x01';
    }
    if ((local_2d == '+') && (!bVar3)) {
      local_2d = ' ';
      *_c = ' ';
    }
    if ((local_2d == '/') && (paVar1->frag_index[0x4c] == '\0')) {
      paVar1->ups = '\x01';
    }
    break;
  case '\x01':
    if (local_2d == '/') {
      return 1;
    }
    if (local_2d == '.') {
      paVar1->ups = '\x02';
      return 1;
    }
    paVar1->ups = '\0';
    break;
  case '\x02':
    if (local_2d == '.') {
      paVar1->ups = '\x03';
      return 1;
    }
    if (local_2d == '/') {
      paVar1->ups = '\x01';
      return 1;
    }
    paVar1->ups = '\0';
    iVar6 = issue_char(wsi,'.');
    if (iVar6 < 0) {
      return -1;
    }
    break;
  case '\x03':
    if ((local_2d == '/') || (local_2d == '?')) {
      if (2 < paVar1->frags[paVar1->nfrag].len) {
        paVar1->pos = paVar1->pos - 1;
        paVar1->frags[paVar1->nfrag].len = paVar1->frags[paVar1->nfrag].len - 1;
        do {
          paVar1->pos = paVar1->pos - 1;
          paVar1->frags[paVar1->nfrag].len = paVar1->frags[paVar1->nfrag].len - 1;
          bVar8 = false;
          if (1 < paVar1->frags[paVar1->nfrag].len) {
            bVar8 = paVar1->data[paVar1->pos] != '/';
          }
        } while (bVar8);
      }
      paVar1->ups = '\x01';
      if (paVar1->frags[paVar1->nfrag].len < 2) {
        return 1;
      }
    }
    else {
      iVar6 = issue_char(wsi,'.');
      if (iVar6 < 0) {
        return -1;
      }
      iVar6 = issue_char(wsi,'.');
      if (iVar6 < 0) {
        return -1;
      }
      paVar1->ups = '\0';
    }
  }
  if (((local_2d != '?') || (bVar3)) || (paVar1->frag_index[0x4c] != '\0')) {
    return 0;
  }
  if (paVar1->ues != '\0') {
    return 2;
  }
  iVar6 = issue_char(wsi,'\0');
  if (-1 < iVar6) {
    paVar2 = (wsi->http).ah;
    bVar5 = ((wsi->http).ah)->nfrag;
    paVar2->frags[bVar5].len = paVar2->frags[bVar5].len - 1;
    paVar1->nfrag = paVar1->nfrag + '\x01';
    if (0x5f < paVar1->nfrag) {
      return 3;
    }
    aVar7 = paVar1->pos + 1;
    paVar1->pos = aVar7;
    paVar1->frags[paVar1->nfrag].offset = aVar7;
    paVar1->frags[paVar1->nfrag].len = 0;
    paVar1->frags[paVar1->nfrag].nfrag = '\0';
    paVar1->post_literal_equal = '\0';
    paVar1->frag_index[0x4c] = paVar1->nfrag;
    paVar1->ups = '\0';
    return 1;
  }
  return -1;
}

Assistant:

int
lws_parse_urldecode(struct lws *wsi, uint8_t *_c)
{
	struct allocated_headers *ah = wsi->http.ah;
	unsigned int enc = 0;
	uint8_t c = *_c;

	// lwsl_notice("ah->ups %d\n", ah->ups);

	/*
	 * PRIORITY 1
	 * special URI processing... convert %xx
	 */
	switch (ah->ues) {
	case URIES_IDLE:
		if (c == '%') {
			ah->ues = URIES_SEEN_PERCENT;
			goto swallow;
		}
		break;
	case URIES_SEEN_PERCENT:
		if (char_to_hex((char)c) < 0)
			/* illegal post-% char */
			goto forbid;

		ah->esc_stash = (char)c;
		ah->ues = URIES_SEEN_PERCENT_H1;
		goto swallow;

	case URIES_SEEN_PERCENT_H1:
		if (char_to_hex((char)c) < 0)
			/* illegal post-% char */
			goto forbid;

		*_c = (uint8_t)(unsigned int)((char_to_hex(ah->esc_stash) << 4) |
				char_to_hex((char)c));
		c = *_c;
		enc = 1;
		ah->ues = URIES_IDLE;
		break;
	}

	/*
	 * PRIORITY 2
	 * special URI processing...
	 *  convert /.. or /... or /../ etc to /
	 *  convert /./ to /
	 *  convert // or /// etc to /
	 *  leave /.dir or whatever alone
	 */

	if (!c && (!ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS] ||
		   !ah->post_literal_equal)) {
		/*
		 * Since user code is typically going to parse the path using
		 * NUL-terminated apis, it's too dangerous to allow NUL
		 * injection here.
		 *
		 * It's allowed in the urlargs, because the apis to access
		 * those only allow retreival with explicit length.
		 */
		lwsl_warn("%s: saw NUL outside of uri args\n", __func__);
		return -1;
	}

	switch (ah->ups) {
	case URIPS_IDLE:

		/* genuine delimiter */
		if ((c == '&' || c == ';') && !enc) {
			if (issue_char(wsi, '\0') < 0)
				return -1;
			/* don't account for it */
			wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
			/* link to next fragment */
			ah->frags[ah->nfrag].nfrag = (uint8_t)(ah->nfrag + 1);
			ah->nfrag++;
			if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frags))
				goto excessive;
			/* start next fragment after the & */
			ah->post_literal_equal = 0;
			ah->frags[ah->nfrag].offset = ++ah->pos;
			ah->frags[ah->nfrag].len = 0;
			ah->frags[ah->nfrag].nfrag = 0;
			goto swallow;
		}
		/* uriencoded = in the name part, disallow */
		if (c == '=' && enc &&
		    ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS] &&
		    !ah->post_literal_equal) {
			c = '_';
			*_c =c;
		}

		/* after the real =, we don't care how many = */
		if (c == '=' && !enc)
			ah->post_literal_equal = 1;

		/* + to space */
		if (c == '+' && !enc) {
			c = ' ';
			*_c = c;
		}
		/* issue the first / always */
		if (c == '/' && !ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS])
			ah->ups = URIPS_SEEN_SLASH;
		break;
	case URIPS_SEEN_SLASH:
		/* swallow subsequent slashes */
		if (c == '/')
			goto swallow;
		/* track and swallow the first . after / */
		if (c == '.') {
			ah->ups = URIPS_SEEN_SLASH_DOT;
			goto swallow;
		}
		ah->ups = URIPS_IDLE;
		break;
	case URIPS_SEEN_SLASH_DOT:
		/* swallow second . */
		if (c == '.') {
			ah->ups = URIPS_SEEN_SLASH_DOT_DOT;
			goto swallow;
		}
		/* change /./ to / */
		if (c == '/') {
			ah->ups = URIPS_SEEN_SLASH;
			goto swallow;
		}
		/* it was like /.dir ... regurgitate the . */
		ah->ups = URIPS_IDLE;
		if (issue_char(wsi, '.') < 0)
			return -1;
		break;

	case URIPS_SEEN_SLASH_DOT_DOT:

		/* /../ or /..[End of URI] --> backup to last / */
		if (c == '/' || c == '?') {
			/*
			 * back up one dir level if possible
			 * safe against header fragmentation because
			 * the method URI can only be in 1 fragment
			 */
			if (ah->frags[ah->nfrag].len > 2) {
				ah->pos--;
				ah->frags[ah->nfrag].len--;
				do {
					ah->pos--;
					ah->frags[ah->nfrag].len--;
				} while (ah->frags[ah->nfrag].len > 1 &&
					 ah->data[ah->pos] != '/');
			}
			ah->ups = URIPS_SEEN_SLASH;
			if (ah->frags[ah->nfrag].len > 1)
				break;
			goto swallow;
		}

		/*  /..[^/] ... regurgitate and allow */

		if (issue_char(wsi, '.') < 0)
			return -1;
		if (issue_char(wsi, '.') < 0)
			return -1;
		ah->ups = URIPS_IDLE;
		break;
	}

	if (c == '?' && !enc &&
	    !ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS]) { /* start of URI args */
		if (ah->ues != URIES_IDLE)
			goto forbid;

		/* seal off uri header */
		if (issue_char(wsi, '\0') < 0)
			return -1;

		/* don't account for it */
		wsi->http.ah->frags[wsi->http.ah->nfrag].len--;

		/* move to using WSI_TOKEN_HTTP_URI_ARGS */
		ah->nfrag++;
		if (ah->nfrag >= LWS_ARRAY_SIZE(ah->frags))
			goto excessive;
		ah->frags[ah->nfrag].offset = ++ah->pos;
		ah->frags[ah->nfrag].len = 0;
		ah->frags[ah->nfrag].nfrag = 0;

		ah->post_literal_equal = 0;
		ah->frag_index[WSI_TOKEN_HTTP_URI_ARGS] = ah->nfrag;
		ah->ups = URIPS_IDLE;
		goto swallow;
	}

	return LPUR_CONTINUE;

swallow:
	return LPUR_SWALLOW;

forbid:
	return LPUR_FORBID;

excessive:
	return LPUR_EXCESSIVE;
}